

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::MatchLiteralEquivInst::Exec
          (MatchLiteralEquivInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  uint uVar3;
  Program *pPVar4;
  long lVar5;
  Type pRVar6;
  code *pcVar7;
  bool bVar8;
  uint uVar9;
  undefined4 *puVar10;
  Type TVar11;
  
  uVar3 = (this->super_LiteralMixin).length;
  uVar9 = *inputOffset;
  if (inputLength - uVar9 < uVar3) {
LAB_00ef6206:
    bVar8 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    pPVar4 = (matcher->program).ptr;
    lVar5 = *(long *)((long)&pPVar4->rep + 0x10);
    TVar11 = (this->super_LiteralMixin).offset;
    uVar3 = TVar11 + uVar3 * 4;
    if ((pPVar4->rep).insts.litbufLen < uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x690,"(literalEndOffset <= matcher.program->rep.insts.litbufLen)",
                         "literalEndOffset <= matcher.program->rep.insts.litbufLen");
      if (!bVar8) {
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar10 = 0;
      uVar9 = *inputOffset;
    }
    pRVar6 = matcher->stats;
    do {
      if (pRVar6 != (Type)0x0) {
        puVar1 = &pRVar6->numCompares;
        *puVar1 = *puVar1 + 1;
      }
      CVar2 = input[uVar9];
      if ((((CVar2 != *(Char *)(lVar5 + (ulong)TVar11 * 2)) &&
           (CVar2 != *(Char *)(lVar5 + (ulong)(TVar11 + 1) * 2))) &&
          (CVar2 != *(Char *)(lVar5 + (ulong)(TVar11 + 2) * 2))) &&
         (CVar2 != *(Char *)(lVar5 + (ulong)(TVar11 + 3) * 2))) goto LAB_00ef6206;
      uVar9 = uVar9 + 1;
      *inputOffset = uVar9;
      TVar11 = TVar11 + 4;
    } while (TVar11 < uVar3);
    *instPointer = *instPointer + 9;
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

inline bool MatchLiteralEquivInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (length > inputLength - inputOffset)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        const Char *const literalBuffer = matcher.program->rep.insts.litbuf;
        CharCount literalOffset = offset;
        const CharCount literalEndOffset = offset + length * CaseInsensitive::EquivClassSize;

        Assert(literalEndOffset <= matcher.program->rep.insts.litbufLen);
        CompileAssert(CaseInsensitive::EquivClassSize == 4);

        do
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            if (input[inputOffset] != literalBuffer[literalOffset]
                && input[inputOffset] != literalBuffer[literalOffset + 1]
                && input[inputOffset] != literalBuffer[literalOffset + 2]
                && input[inputOffset] != literalBuffer[literalOffset + 3])
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }
            inputOffset++;
            literalOffset += CaseInsensitive::EquivClassSize;
        }
        while (literalOffset < literalEndOffset);

        instPointer += sizeof(*this);
        return false;
    }